

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

bool __thiscall onmt::Tokenizer::Options::add_alphabet_to_segment(Options *this,string *alphabet)

{
  int iVar1;
  char *in_RSI;
  int code;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::c_str();
  iVar1 = unicode::get_script_code(in_RSI);
  if (-1 < iVar1) {
    std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>::
    emplace<int_const&>((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        (int *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
  }
  return -1 < iVar1;
}

Assistant:

bool Tokenizer::Options::add_alphabet_to_segment(const std::string& alphabet)
  {
    const int code = unicode::get_script_code(alphabet.c_str());
    if (code < 0)
      return false;
    segment_alphabet_codes.emplace(code);
    return true;
  }